

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Device.cpp
# Opt level: O1

void __thiscall
myvk::QueueSelectionResolver::EnumerateDeviceQueueCreateInfos
          (QueueSelectionResolver *this,
          vector<VkDeviceQueueCreateInfo,_std::allocator<VkDeviceQueueCreateInfo>_>
          *out_create_infos,vector<float,_std::allocator<float>_> *out_priorities)

{
  _Rb_tree_header *p_Var1;
  pointer *ppVVar2;
  pointer pVVar3;
  pointer pfVar4;
  iterator __position;
  ulong __new_size;
  _Rb_tree_node_base *p_Var5;
  ulong uVar6;
  ulong uVar7;
  VkDeviceQueueCreateInfo info;
  VkDeviceQueueCreateInfo local_58;
  
  pVVar3 = (out_create_infos->
           super__Vector_base<VkDeviceQueueCreateInfo,_std::allocator<VkDeviceQueueCreateInfo>_>).
           _M_impl.super__Vector_impl_data._M_start;
  if ((out_create_infos->
      super__Vector_base<VkDeviceQueueCreateInfo,_std::allocator<VkDeviceQueueCreateInfo>_>)._M_impl
      .super__Vector_impl_data._M_finish != pVVar3) {
    (out_create_infos->
    super__Vector_base<VkDeviceQueueCreateInfo,_std::allocator<VkDeviceQueueCreateInfo>_>)._M_impl.
    super__Vector_impl_data._M_finish = pVVar3;
  }
  pfVar4 = (out_priorities->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
           super__Vector_impl_data._M_start;
  if ((out_priorities->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
      super__Vector_impl_data._M_finish != pfVar4) {
    (out_priorities->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
    super__Vector_impl_data._M_finish = pfVar4;
  }
  if ((this->m_queue_creations)._M_t._M_impl.super__Rb_tree_header._M_node_count != 0) {
    p_Var5 = (this->m_queue_creations)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    p_Var1 = &(this->m_queue_creations)._M_t._M_impl.super__Rb_tree_header;
    __new_size = 0;
    while ((_Rb_tree_header *)p_Var5 != p_Var1) {
      uVar6 = ((long)p_Var5[1]._M_left - (long)p_Var5[1]._M_parent >> 3) * -0x5555555555555555;
      uVar7 = uVar6 & 0xffffffff;
      if (uVar6 < __new_size || uVar6 - __new_size == 0) {
        uVar7 = __new_size;
      }
      p_Var5 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var5);
      __new_size = uVar7;
    }
    local_58.sType = 0x3f800000;
    std::vector<float,_std::allocator<float>_>::resize
              (out_priorities,__new_size,(value_type_conflict3 *)&local_58);
    for (p_Var5 = (this->m_queue_creations)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
        (_Rb_tree_header *)p_Var5 != p_Var1;
        p_Var5 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var5)) {
      local_58.pNext = (void *)0x0;
      local_58.sType = VK_STRUCTURE_TYPE_DEVICE_QUEUE_CREATE_INFO;
      local_58._4_4_ = 0;
      local_58._16_8_ = (ulong)p_Var5[1]._M_color << 0x20;
      local_58.queueCount =
           (int)((ulong)((long)p_Var5[1]._M_left - (long)p_Var5[1]._M_parent) >> 3) * -0x55555555;
      local_58._28_4_ = 0;
      local_58.pQueuePriorities =
           (out_priorities->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
           super__Vector_impl_data._M_start;
      __position._M_current =
           (out_create_infos->
           super__Vector_base<VkDeviceQueueCreateInfo,_std::allocator<VkDeviceQueueCreateInfo>_>).
           _M_impl.super__Vector_impl_data._M_finish;
      if (__position._M_current ==
          (out_create_infos->
          super__Vector_base<VkDeviceQueueCreateInfo,_std::allocator<VkDeviceQueueCreateInfo>_>).
          _M_impl.super__Vector_impl_data._M_end_of_storage) {
        std::vector<VkDeviceQueueCreateInfo,std::allocator<VkDeviceQueueCreateInfo>>::
        _M_realloc_insert<VkDeviceQueueCreateInfo_const&>
                  ((vector<VkDeviceQueueCreateInfo,std::allocator<VkDeviceQueueCreateInfo>> *)
                   out_create_infos,__position,&local_58);
      }
      else {
        (__position._M_current)->pQueuePriorities = local_58.pQueuePriorities;
        (__position._M_current)->flags = local_58.flags;
        (__position._M_current)->queueFamilyIndex = local_58.queueFamilyIndex;
        (__position._M_current)->queueCount = local_58.queueCount;
        *(undefined4 *)&(__position._M_current)->field_0x1c = 0;
        *(undefined8 *)__position._M_current = 2;
        (__position._M_current)->pNext = (void *)0x0;
        ppVVar2 = &(out_create_infos->
                   super__Vector_base<VkDeviceQueueCreateInfo,_std::allocator<VkDeviceQueueCreateInfo>_>
                   )._M_impl.super__Vector_impl_data._M_finish;
        *ppVVar2 = *ppVVar2 + 1;
      }
    }
  }
  return;
}

Assistant:

void QueueSelectionResolver::EnumerateDeviceQueueCreateInfos(std::vector<VkDeviceQueueCreateInfo> *out_create_infos,
                                                             std::vector<float> *out_priorities) const {
	out_create_infos->clear();
	out_priorities->clear();

	if (m_queue_creations.empty())
		return;

	uint32_t max_queue_count = 0;
	for (const auto &i : m_queue_creations) {
		if (i.second.size() > max_queue_count)
			max_queue_count = i.second.size();
	}
	out_priorities->resize(max_queue_count, 1.0f);

	for (const auto &i : m_queue_creations) {
		VkDeviceQueueCreateInfo info = {};
		info.sType = VK_STRUCTURE_TYPE_DEVICE_QUEUE_CREATE_INFO;
		info.queueFamilyIndex = i.first;
		info.queueCount = i.second.size();
		info.pQueuePriorities = out_priorities->data();
		out_create_infos->push_back(info);
	}
}